

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int lws_is_final_fragment(lws *wsi)

{
  byte local_11;
  lws *wsi_local;
  
  local_11 = 0;
  if ((*(ushort *)&wsi->ws->field_0x95 & 1) != 0) {
    local_11 = wsi->ws->rx_packet_length != 0 ^ 0xff;
  }
  return (int)(local_11 & 1);
}

Assistant:

int
lws_is_final_fragment(struct lws *wsi)
{
#if !defined(LWS_WITHOUT_EXTENSIONS)
	lwsl_debug("%s: final %d, rx pk length %ld, draining %ld\n", __func__,
		   wsi->ws->final, (long)wsi->ws->rx_packet_length,
		   (long)wsi->ws->rx_draining_ext);
	return wsi->ws->final && !wsi->ws->rx_packet_length &&
	       !wsi->ws->rx_draining_ext;
#else
	return wsi->ws->final && !wsi->ws->rx_packet_length;
#endif
}